

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O2

void __thiscall libsgp4::Tle::Initialize(Tle *this)

{
  Tle *pTVar1;
  Tle *pTVar2;
  TleException *this_00;
  uint year_00;
  string *psVar3;
  string local_60;
  uint year;
  uint sat_number_2;
  uint sat_number_1;
  double day;
  
  if (*(long *)(this + 0x28) == 0x45) {
    if (*(long *)(this + 0x48) == 0x45) {
      pTVar1 = this + 0x20;
      if (**(char **)pTVar1 == '1') {
        pTVar2 = this + 0x40;
        if (**(char **)pTVar2 == '2') {
          psVar3 = &local_60;
          std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
          ExtractInteger((Tle *)psVar3,&local_60,&sat_number_1);
          std::__cxx11::string::~string((string *)&local_60);
          psVar3 = &local_60;
          std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
          ExtractInteger((Tle *)psVar3,&local_60,&sat_number_2);
          std::__cxx11::string::~string((string *)&local_60);
          if (sat_number_1 == sat_number_2) {
            *(uint *)(this + 0xd0) = sat_number_1;
            if (*(long *)(this + 8) == 0) {
              std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
              std::__cxx11::string::operator=((string *)this,(string *)&local_60);
              std::__cxx11::string::~string((string *)&local_60);
            }
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            std::__cxx11::string::operator=((string *)(this + 0x60),(string *)&local_60);
            std::__cxx11::string::~string((string *)&local_60);
            year = 0;
            day = 0.0;
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            ExtractInteger((Tle *)psVar3,&local_60,&year);
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            ExtractDouble((Tle *)psVar3,&local_60,4,&day);
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            ExtractDouble((Tle *)psVar3,&local_60,2,(double *)(this + 0x88));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            ExtractExponential((Tle *)psVar3,&local_60,(double *)(this + 0x90));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar1);
            ExtractExponential((Tle *)psVar3,&local_60,(double *)(this + 0x98));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,4,(double *)(this + 0xa0));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,4,(double *)(this + 0xa8));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,-1,(double *)(this + 0xb0));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,4,(double *)(this + 0xb8));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,4,(double *)(this + 0xc0));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractDouble((Tle *)psVar3,&local_60,3,(double *)(this + 200));
            std::__cxx11::string::~string((string *)&local_60);
            psVar3 = &local_60;
            std::__cxx11::string::substr((ulong)&local_60,(ulong)pTVar2);
            ExtractInteger((Tle *)psVar3,&local_60,(uint *)(this + 0xd4));
            std::__cxx11::string::~string((string *)&local_60);
            year_00 = year + 2000;
            if (0x38 < year) {
              year_00 = year + 0x76c;
            }
            DateTime::DateTime((DateTime *)&local_60,year_00,day);
            *(pointer *)(this + 0x80) = local_60._M_dataplus._M_p;
            return;
          }
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Satellite numbers do not match");
        }
        else {
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Invalid line beginning for line two");
        }
      }
      else {
        this_00 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(this_00,"Invalid line beginning for line one");
      }
    }
    else {
      this_00 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(this_00,"Invalid length for line two");
    }
  }
  else {
    this_00 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(this_00,"Invalid length for line one");
  }
  __cxa_throw(this_00,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Tle::IsValidLineLength(const std::string& str)
{
    return str.length() == LineLength() ? true : false;
}